

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O0

bool BasePort::HardwareVersionValid(unsigned_long hver)

{
  size_type sVar1;
  reference pvVar2;
  ulong local_20;
  size_t i;
  bool valid;
  unsigned_long hver_local;
  
  local_20 = 0;
  while( true ) {
    sVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&SupportedHardware);
    if (sVar1 <= local_20) {
      return false;
    }
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&SupportedHardware,local_20);
    if (*pvVar2 == hver) break;
    local_20 = local_20 + 1;
  }
  return true;
}

Assistant:

bool BasePort::HardwareVersionValid(unsigned long hver)
{
    bool valid = false;
    for (size_t i = 0; i < SupportedHardware.size(); i++) {
        if (SupportedHardware[i] == hver) {
            valid = true;
            break;
        }
    }
    return valid;
}